

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O0

wchar_t monster_primary_group_size(chunk *c,monster *mon)

{
  mon_group_list_entry_conflict *local_30;
  mon_group_list_entry_conflict *entry;
  monster_group_conflict *group;
  wchar_t index;
  wchar_t count;
  monster *mon_local;
  chunk *c_local;
  
  group._4_4_ = L'\0';
  for (local_30 = c->monster_groups[mon->group_info[0].index]->member_list;
      local_30 != (mon_group_list_entry_conflict *)0x0; local_30 = local_30->next) {
    group._4_4_ = group._4_4_ + L'\x01';
  }
  return group._4_4_;
}

Assistant:

int monster_primary_group_size(struct chunk *c, const struct monster *mon)
{
	int count = 0;
	int index = mon->group_info[PRIMARY_GROUP].index;
	struct monster_group *group = c->monster_groups[index];
	struct mon_group_list_entry *entry = group->member_list;

	while (entry) {
		count++;
		entry = entry->next;
	}
	return count;
}